

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::PushDebuggerScope(ByteCodeWriter *this,DebuggerScope *debuggerScope)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DebuggerScope *debuggerScope_local;
  ByteCodeWriter *this_local;
  
  if (debuggerScope == (DebuggerScope *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xbef,"(debuggerScope)","debuggerScope");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  DebuggerScope::SetParentScope(debuggerScope,this->m_currentDebuggerScope);
  this->m_currentDebuggerScope = debuggerScope;
  if ((DAT_01ec73ca & 1) != 0) {
    Output::Trace(DebuggerPhase,L"PushDebuggerScope() - Pushed scope 0x%p of type %d.\n",
                  this->m_currentDebuggerScope,(ulong)this->m_currentDebuggerScope->scopeType);
  }
  return;
}

Assistant:

void ByteCodeWriter::PushDebuggerScope(Js::DebuggerScope* debuggerScope)
    {
        Assert(debuggerScope);

        debuggerScope->SetParentScope(m_currentDebuggerScope);
        m_currentDebuggerScope = debuggerScope;
        OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("PushDebuggerScope() - Pushed scope 0x%p of type %d.\n"), m_currentDebuggerScope, m_currentDebuggerScope->scopeType);
    }